

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopsops.c
# Opt level: O2

LispPTR LCFindVarIndex(LispPTR iv,LispPTR object)

{
  LispPTR *pLVar1;
  LispPTR LVar2;
  LispPTR *pLVar3;
  ulong uVar4;
  LispPTR LVar5;
  uint uVar6;
  uint uVar7;
  
  if (atom_instance == 0) {
    LCinit();
  }
  uVar6 = *(ushort *)((ulong)(object >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff;
  uVar6 = *(uint *)((long)DTDspace + (ulong)uVar6 * 4 + (ulong)(uVar6 << 5)) & 0xfffffff;
  if ((uVar6 == atom_instance) || (uVar6 == atom_class)) {
    pLVar3 = NativeAligned4FromLAddr(object);
    uVar6 = pLVar3[1];
    uVar4 = (ulong)(((uVar6 ^ iv) & 0x3ff) << 4);
    pLVar1 = (LispPTR *)((long)&LCIVCache->iNames + uVar4);
    if ((*(uint *)((long)&LCIVCache->iNames + uVar4) == uVar6) && (pLVar1[1] == iv)) {
      LVar5 = pLVar1[2];
    }
    else {
      LVar5 = 0;
      if ((*(ushort *)((ulong)(uVar6 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) == 5) {
        LVar5 = 0;
        uVar7 = 0;
        while (uVar6 = cdr(uVar6), uVar6 != 0) {
          LVar2 = car(uVar6);
          if (LVar2 == iv) {
            *pLVar1 = pLVar3[1];
            pLVar1[1] = iv;
            pLVar1[2] = uVar7 | 0xe0000;
            return uVar7 | 0xe0000;
          }
          uVar7 = uVar7 + 1;
        }
      }
    }
  }
  else {
    lcfuncall(atom_FindVarIndex_LCUFN,2,3);
    LVar5 = 0xfffffffe;
  }
  return LVar5;
}

Assistant:

LispPTR LCFindVarIndex(LispPTR iv, LispPTR object) {
  struct LCInstance *objptr;
  struct LCIVCacheEntry *ce;
  LispPTR iNames;

  LC_INIT;

  INSTANCE_CLASS_OR_PUNT(object, atom_FindVarIndex_LCUFN, 2);

  objptr = (struct LCInstance *)NativeAligned4FromLAddr(object);
  ce = &(LCIVCache[IV_CACHE_INDEX((iNames = objptr->iNames), iv)]);
  if (ce->iNames == iNames && ce->iv == iv) return ce->index;

  if (!Listp(iNames)) return NIL_PTR; /* FastFindIndex lisp macro (& others?) */
                                      /* needs this check too ! */
  {
    int i;

    for (i = 0; (iNames = cdr(iNames)) != NIL_PTR; i++) {
      if (car(iNames) == iv) {
        ce->iNames = objptr->iNames;
        ce->iv = iv;
        return (ce->index = SMALLP_FROM_POSINT(i));
      }
    }
    return NIL_PTR;
  }
}